

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

module_ __thiscall
pybind11::module_::create_extension_module(module_ *this,char *name,char *doc,module_def *def)

{
  bool bVar1;
  long lVar2;
  error_already_set *this_00;
  module_def *local_70;
  handle local_48 [3];
  PyObject *local_30;
  PyObject *m;
  module_def *def_local;
  char *doc_local;
  char *name_local;
  
  (def->m_base).ob_base.ob_refcnt = 1;
  (def->m_base).ob_base.ob_type = (PyTypeObject *)0x0;
  (def->m_base).m_init = (_func_PyObject_ptr *)0x0;
  (def->m_base).m_index = 0;
  (def->m_base).m_copy = (PyObject *)0x0;
  def->m_name = name;
  m = (PyObject *)def;
  def_local = (module_def *)doc;
  doc_local = name;
  name_local = (char *)this;
  bVar1 = options::show_user_defined_docstrings();
  if (bVar1) {
    local_70 = def_local;
  }
  else {
    local_70 = (module_def *)0x0;
  }
  def->m_doc = (char *)local_70;
  def->m_size = -1;
  def->m_methods = (PyMethodDef *)0x0;
  def->m_slots = (PyModuleDef_Slot *)0x0;
  def->m_traverse = (traverseproc)0x0;
  def->m_clear = (inquiry)0x0;
  def->m_free = (freefunc)0x0;
  m = (PyObject *)def;
  local_30 = (PyObject *)PyModule_Create2(def,0x3f5);
  if (local_30 == (PyObject *)0x0) {
    lVar2 = PyErr_Occurred();
    if (lVar2 != 0) {
      this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this_00);
      __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    pybind11_fail("Internal error in module_::create_extension_module()");
  }
  handle::handle(local_48,local_30);
  reinterpret_borrow<pybind11::module_>((pybind11 *)this,local_48[0]);
  return (object)(object)this;
}

Assistant:

static module_ create_extension_module(const char *name, const char *doc, module_def *def) {
#if PY_MAJOR_VERSION >= 3
        // module_def is PyModuleDef
        // Placement new (not an allocation).
        def = new (def)
            PyModuleDef{/* m_base */ PyModuleDef_HEAD_INIT,
                        /* m_name */ name,
                        /* m_doc */ options::show_user_defined_docstrings() ? doc : nullptr,
                        /* m_size */ -1,
                        /* m_methods */ nullptr,
                        /* m_slots */ nullptr,
                        /* m_traverse */ nullptr,
                        /* m_clear */ nullptr,
                        /* m_free */ nullptr};
        auto *m = PyModule_Create(def);
#else
        // Ignore module_def *def; only necessary for Python 3
        (void) def;
        auto m = Py_InitModule3(
            name, nullptr, options::show_user_defined_docstrings() ? doc : nullptr);
#endif
        if (m == nullptr) {
            if (PyErr_Occurred()) {
                throw error_already_set();
            }
            pybind11_fail("Internal error in module_::create_extension_module()");
        }
        // TODO: Should be reinterpret_steal for Python 3, but Python also steals it again when
        // returned from PyInit_...
        //       For Python 2, reinterpret_borrow is correct.
        return reinterpret_borrow<module_>(m);
    }